

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O0

int __thiscall diy::Collection::add(Collection *this,Element e)

{
  int *piVar1;
  size_type sVar2;
  int __type;
  value_type_conflict *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  std::vector<void_*,_std::allocator<void_*>_>::push_back
            ((vector<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffffe0,
             (value_type *)in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffd0,in_RDI);
  critical_resource<int,_std::recursive_mutex>::access
            ((critical_resource<int,_std::recursive_mutex> *)&stack0xffffffffffffffd0,
             (char *)(in_RDI + 0x2e),__type);
  piVar1 = resource_accessor<int,_std::recursive_mutex>::operator*
                     ((resource_accessor<int,_std::recursive_mutex> *)&stack0xffffffffffffffd0);
  *piVar1 = *piVar1 + 1;
  resource_accessor<int,_std::recursive_mutex>::~resource_accessor
            ((resource_accessor<int,_std::recursive_mutex> *)0x18be05);
  sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)(in_RDI + 0x22));
  return (int)sVar2 + -1;
}

Assistant:

int           add(Element e)                  { elements_.push_back(e); external_.push_back(-1); ++(*in_memory_.access()); return static_cast<int>(elements_.size()) - 1; }